

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_drawing.cpp
# Opt level: O3

void CMU462::Misc::draw_sphere(Vector3D *p,double r)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  double local_78;
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  double dStack_40;
  double local_38;
  
  if (initialized == '\0') {
    init_mesh();
    initialized = '\x01';
  }
  glMatrixMode(0x1700);
  glPushMatrix();
  glTranslated(p->x,SUB84(p->y,0),p->z);
  glScaled(r,SUB84(r,0),r);
  uVar5 = 0xfffffffffffffffd;
  do {
    glBegin(9);
    uVar2 = (ulong)(Indices[uVar5 + 3] << 3);
    uVar3 = (ulong)(Indices[uVar5 + 4] << 3);
    uVar4 = (ulong)(Indices[uVar5 + 5] << 3);
    local_38 = Vertices[uVar2 + 4];
    local_48 = Vertices[uVar2 + 2];
    dStack_40 = Vertices[uVar2 + 3];
    local_58 = Vertices[uVar3 + 4];
    local_68 = Vertices[uVar3 + 2];
    dStack_60 = Vertices[uVar3 + 3];
    lVar1 = uVar4 * 8;
    local_78 = Vertices[uVar4 + 4];
    local_88 = *(undefined4 *)(Vertices + uVar4 + 2);
    uStack_84 = *(undefined4 *)((long)Vertices + lVar1 + 0x14);
    uStack_80 = *(undefined4 *)(Vertices + uVar4 + 3);
    uStack_7c = *(undefined4 *)((long)Vertices + lVar1 + 0x1c);
    glNormal3dv(&local_48);
    glVertex3dv(uVar2 * 8 + 0x26dda8);
    glNormal3dv(&local_68);
    glVertex3dv(uVar3 * 8 + 0x26dda8);
    glNormal3dv(&local_88);
    glVertex3dv(lVar1 + 0x26dda8);
    glEnd();
    uVar5 = uVar5 + 3;
  } while (uVar5 < 0xbb7d);
  glPopMatrix();
  return;
}

Assistant:

void draw_sphere(const Vector3D& p, double r) {
  if (!initialized) {
    init_mesh();
    initialized = true;
  }

  glMatrixMode(GL_MODELVIEW);
  glPushMatrix();
  glTranslated(p.x, p.y, p.z);
  glScaled(r, r, r);

  for (int i = 0; i < SPHERE_NUM_INDICES; i += 3) {
    glBegin(GL_POLYGON);
    double *vPtr1 = &Vertices[VERTEX_SIZE * Indices[i]];
    double *vPtr2 = &Vertices[VERTEX_SIZE * Indices[i + 1]];
    double *vPtr3 = &Vertices[VERTEX_SIZE * Indices[i + 2]];
    Vector3D n1(vPtr1[NORMAL_OFFSET],
                vPtr1[NORMAL_OFFSET + 1],
                vPtr1[NORMAL_OFFSET + 2]);
    Vector3D n2(vPtr2[NORMAL_OFFSET],
                vPtr2[NORMAL_OFFSET + 1],
                vPtr2[NORMAL_OFFSET + 2]);
    Vector3D n3(vPtr3[NORMAL_OFFSET],
                vPtr3[NORMAL_OFFSET + 1],
                vPtr3[NORMAL_OFFSET + 2]);
    const Vector3D& n = (n1 + n2 + n3).unit();
    glNormal3dv(&n1.x);
    glVertex3dv(vPtr1 + VERTEX_OFFSET);
    glNormal3dv(&n2.x);
    glVertex3dv(vPtr2 + VERTEX_OFFSET);
    glNormal3dv(&n3.x);
    glVertex3dv(vPtr3 + VERTEX_OFFSET);
    glEnd();
  }

  /*
  TODO: when I use this scratch code to render the mesh using the more efficient
        glDrawElements, it works for a single frame and then fails on all
        successive frames. Any opengl experts care to figure out why?
  glEnableClientState(GL_NORMAL_ARRAY);
  glEnableClientState(GL_VERTEX_ARRAY);
  glEnable(GL_NORMALIZE);
  for (int i = 0; i < SPHERE_NUM_VERTICES; i++) {
    normals[3 * i] = Vertices[8 * i + 2];
    normals[3 * i + 1] = Vertices[8 * i + 3];
    normals[3 * i + 2] = Vertices[8 * i + 4];
    vertices[3 * i] = Vertices[8 * i + 5];
    vertices[3 * i + 1] = Vertices[8 * i + 6];
    vertices[3 * i + 2] = Vertices[8 * i + 7];
  }

  glVertexPointer(3, GL_DOUBLE, 0, vertices);
  glNormalPointer(GL_DOUBLE, 0, normals);
  glDrawElements(GL_TRIANGLES, SPHERE_NUM_INDICES, GL_UNSIGNED_INT, Indices);
  */

  glPopMatrix();
}